

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O3

void __thiscall efsw::DirectorySnapshot::~DirectorySnapshot(DirectorySnapshot *this)

{
  pointer pcVar1;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
  ::~_Rb_tree(&(this->Files)._M_t);
  pcVar1 = (this->DirectoryInfo).Filepath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->DirectoryInfo).Filepath.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

DirectorySnapshot::~DirectorySnapshot() {}